

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O0

void Mio_LibrarySortGates(Mio_Library_t *pLib)

{
  Mio_Gate_t **__base;
  Mio_Gate_t **ppMVar1;
  Mio_Gate_t *local_30;
  int local_24;
  Mio_Gate_t *pMStack_20;
  int i;
  Mio_Gate_t *pGate;
  Mio_Gate_t **ppGates;
  Mio_Library_t *pLib_local;
  
  local_24 = 0;
  __base = (Mio_Gate_t **)malloc((long)pLib->nGates << 3);
  pMStack_20 = Mio_LibraryReadGates(pLib);
  while (pMStack_20 != (Mio_Gate_t *)0x0) {
    pMStack_20->Cell = local_24;
    __base[local_24] = pMStack_20;
    pMStack_20 = Mio_GateReadNext(pMStack_20);
    local_24 = local_24 + 1;
  }
  if (local_24 == pLib->nGates) {
    ppMVar1 = (Mio_Gate_t **)malloc((long)pLib->nGates << 3);
    pLib->ppGates0 = ppMVar1;
    for (local_24 = 0; local_24 < pLib->nGates; local_24 = local_24 + 1) {
      pLib->ppGates0[local_24] = __base[local_24];
    }
    qsort(__base,(long)pLib->nGates,8,Mio_LibraryCompareGatesByName);
    for (local_24 = 0; local_24 < pLib->nGates; local_24 = local_24 + 1) {
      if (local_24 < pLib->nGates + -1) {
        local_30 = __base[local_24 + 1];
      }
      else {
        local_30 = (Mio_Gate_t *)0x0;
      }
      __base[local_24]->pNext = local_30;
    }
    pLib->pGates = *__base;
    pLib->ppGatesName = __base;
    return;
  }
  __assert_fail("i == pLib->nGates",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioRead.c"
                ,0x251,"void Mio_LibrarySortGates(Mio_Library_t *)");
}

Assistant:

void Mio_LibrarySortGates( Mio_Library_t * pLib )
{
    Mio_Gate_t ** ppGates, * pGate;
    int i = 0;
    ppGates = ABC_ALLOC( Mio_Gate_t *, pLib->nGates );
    Mio_LibraryForEachGate( pLib, pGate )
    {
        pGate->Cell = i;
        ppGates[i++] = pGate;
    }
    assert( i == pLib->nGates );
    // sort gates by name
    pLib->ppGates0 = ABC_ALLOC( Mio_Gate_t *, pLib->nGates );
    for ( i = 0; i < pLib->nGates; i++ )
        pLib->ppGates0[i] = ppGates[i];
    qsort( (void *)ppGates, (size_t)pLib->nGates, sizeof(void *), 
            (int (*)(const void *, const void *)) Mio_LibraryCompareGatesByName );
    for ( i = 0; i < pLib->nGates; i++ )
        ppGates[i]->pNext = (i < pLib->nGates-1)? ppGates[i+1] : NULL;
    pLib->pGates = ppGates[0];
    pLib->ppGatesName = ppGates;
}